

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O2

int Rsb_ManPerformResub6
              (Rsb_Man_t *p,int nVarsAll,word uTruth,Vec_Wrd_t *vDivTruths,word *puTruth0,
              word *puTruth1,int fVerbose)

{
  uint nGs;
  int nVars;
  uint Truth4;
  long lVar1;
  word wVar2;
  ulong uVar3;
  int iVar4;
  word uTruth_local;
  word *pGs [200];
  
  nGs = vDivTruths->nSize;
  uTruth_local = uTruth;
  if ((int)nGs < 200) {
    lVar1 = 0;
    uVar3 = 0;
    if (0 < (int)nGs) {
      uVar3 = (ulong)nGs;
    }
    for (; uVar3 * 8 != lVar1; lVar1 = lVar1 + 8) {
      *(long *)((long)pGs + lVar1) = (long)vDivTruths->pArray + lVar1;
    }
    Truth4 = Rsb_DecPerformInt(p,nVarsAll,&uTruth_local,pGs,nGs,nGs,0);
    if (Truth4 == 0) {
      iVar4 = 0;
    }
    else {
      if (fVerbose != 0) {
        Rsb_DecPrintFunc(p,Truth4,&uTruth_local,pGs,nGs,nVarsAll);
        Rsb_DecPrintTable(p->vCexes->pArray,nGs,nGs,p->vTries);
      }
      nVars = p->vFanins->nSize;
      wVar2 = Abc_Tt6Stretch((ulong)Truth4,nVars);
      *puTruth0 = wVar2;
      iVar4 = 1;
      wVar2 = Abc_Tt6Stretch((ulong)(Truth4 >> ((byte)(1 << ((byte)nVars & 0x1f)) & 0x1f)),nVars);
      *puTruth1 = wVar2;
    }
    return iVar4;
  }
  __assert_fail("nGs < 200",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/rsb/rsbDec6.c"
                ,699,
                "int Rsb_ManPerformResub6(Rsb_Man_t *, int, word, Vec_Wrd_t *, word *, word *, int)"
               );
}

Assistant:

int Rsb_ManPerformResub6( Rsb_Man_t * p, int nVarsAll, word uTruth, Vec_Wrd_t * vDivTruths, word * puTruth0, word * puTruth1, int fVerbose )
{
    word * pGs[200];
    unsigned uTruthRes;
    int i, nVars, nGs = Vec_WrdSize(vDivTruths);
    assert( nGs < 200 );
    for ( i = 0; i < nGs; i++ )
        pGs[i] = Vec_WrdEntryP(vDivTruths,i);
    uTruthRes = Rsb_DecPerformInt( p, nVarsAll, &uTruth, pGs, nGs, nGs, 0 );
    if ( uTruthRes == 0 )
        return 0;

    if ( fVerbose )
        Rsb_DecPrintFunc( p, uTruthRes, &uTruth, pGs, nGs, nVarsAll );
    if ( fVerbose )
        Rsb_DecPrintTable( Vec_WrdArray(p->vCexes), nGs, nGs, p->vTries );

    nVars = Vec_IntSize(p->vFanins);
    *puTruth0 = Abc_Tt6Stretch( uTruthRes,                 nVars );
    *puTruth1 = Abc_Tt6Stretch( uTruthRes >> (1 << nVars), nVars );
    return 1;
}